

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O3

void __thiscall OPL_RDOSdump::WriteDelay(OPL_RDOSdump *this,int ticks)

{
  bool bVar1;
  ulong in_RAX;
  uint uVar2;
  uint uVar3;
  BYTE delay [2];
  undefined8 uStack_28;
  
  if (0 < ticks) {
    uVar2 = ticks * (this->super_OPLDump).TickMul;
    uStack_28 = in_RAX & 0xffffffffffffff;
    if (0xff < (int)uVar2) {
      uVar3 = uVar2;
      do {
        uVar2 = uVar3 - 0xff;
        uStack_28._0_7_ = CONCAT16(0xff,(undefined6)uStack_28);
        fwrite((void *)((long)&uStack_28 + 6),1,2,(FILE *)(this->super_OPLDump).File);
        bVar1 = 0x1fe < uVar3;
        uVar3 = uVar2;
      } while (bVar1);
    }
    uStack_28._0_7_ = CONCAT16((char)uVar2,(undefined6)uStack_28);
    fwrite((void *)((long)&uStack_28 + 6),1,2,(FILE *)(this->super_OPLDump).File);
  }
  return;
}

Assistant:

virtual void WriteDelay(int ticks)
	{
		if (ticks > 0)
		{ // RDos raw has very precise delays but isn't very efficient at
		  // storing long delays.
			BYTE delay[2];

			ticks *= TickMul;
			delay[1] = 0;
			while (ticks > 255)
			{
				ticks -= 255;
				delay[0] = 255;
				fwrite(delay, 1, 2, File);
			}
			delay[0] = BYTE(ticks);
			fwrite(delay, 1, 2, File);
		}
	}